

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

int get_request_handler(mg_connection *conn,int handler_type,mg_request_handler *handler,
                       mg_websocket_subprotocols **subprotocols,
                       mg_websocket_connect_handler *connect_handler,
                       mg_websocket_ready_handler *ready_handler,
                       mg_websocket_data_handler *data_handler,
                       mg_websocket_close_handler *close_handler,
                       mg_authorization_handler *auth_handler,void **cbdata,
                       mg_handler_info **handler_info)

{
  char *__s;
  mg_domain_context *pmVar1;
  mg_handler_info *pmVar2;
  ulong __n;
  int iVar3;
  size_t sVar4;
  ptrdiff_t pVar5;
  mg_authorization_handler p_Var6;
  int iVar7;
  mg_handler_info **ppmVar8;
  int local_5c;
  
  if ((conn != (mg_connection *)0x0) && (conn->connection_type == 1)) {
    __s = (conn->request_info).local_uri;
    sVar4 = strlen(__s);
    if ((conn->phys_ctx != (mg_context *)0x0) && (conn->dom_ctx != (mg_domain_context *)0x0)) {
      mg_lock_context(conn->phys_ctx);
      pmVar1 = conn->dom_ctx;
      local_5c = 0;
      iVar7 = 0;
LAB_001191e6:
      do {
        ppmVar8 = &pmVar1->handlers;
        if (2 < iVar7) {
LAB_0011930b:
          mg_unlock_context(conn->phys_ctx);
          return local_5c;
        }
        while (pmVar2 = *ppmVar8, pmVar2 != (mg_handler_info *)0x0) {
          if (pmVar2->handler_type == handler_type) {
            if (iVar7 == 1) {
              __n = pmVar2->uri_len;
              if ((__n < sVar4) && (__s[__n] == '/')) {
                iVar3 = bcmp(pmVar2->uri,__s,__n);
LAB_0011923a:
                if (iVar3 == 0) {
LAB_0011925f:
                  if (handler_type == 0) {
                    iVar7 = 3;
                    if (pmVar2->removing != 0) goto LAB_001191e6;
                    *handler = pmVar2->handler;
                    pmVar2->refcount = pmVar2->refcount + 1;
                    *handler_info = pmVar2;
                  }
                  else {
                    if (handler_type == 1) {
                      *subprotocols = pmVar2->subprotocols;
                      *connect_handler = pmVar2->connect_handler;
                      *ready_handler = pmVar2->ready_handler;
                      *data_handler = pmVar2->data_handler;
                      p_Var6 = (mg_authorization_handler)pmVar2->close_handler;
                    }
                    else {
                      p_Var6 = pmVar2->auth_handler;
                      close_handler = (mg_websocket_close_handler *)auth_handler;
                    }
                    *close_handler = (mg_websocket_close_handler)p_Var6;
                  }
                  *cbdata = pmVar2->cbdata;
                  local_5c = 1;
                  goto LAB_0011930b;
                }
              }
            }
            else if (iVar7 == 0) {
              if (pmVar2->uri_len == sVar4) {
                iVar3 = strcmp(pmVar2->uri,__s);
                goto LAB_0011923a;
              }
            }
            else {
              pVar5 = match_prefix(pmVar2->uri,pmVar2->uri_len,__s);
              if (0 < pVar5) goto LAB_0011925f;
            }
          }
          ppmVar8 = &pmVar2->next;
        }
        iVar7 = iVar7 + 1;
      } while( true );
    }
  }
  return 0;
}

Assistant:

static int
get_request_handler(struct mg_connection *conn,
                    int handler_type,
                    mg_request_handler *handler,
                    struct mg_websocket_subprotocols **subprotocols,
                    mg_websocket_connect_handler *connect_handler,
                    mg_websocket_ready_handler *ready_handler,
                    mg_websocket_data_handler *data_handler,
                    mg_websocket_close_handler *close_handler,
                    mg_authorization_handler *auth_handler,
                    void **cbdata,
                    struct mg_handler_info **handler_info)
{
	const struct mg_request_info *request_info = mg_get_request_info(conn);
	if (request_info) {
		const char *uri = request_info->local_uri;
		size_t urilen = strlen(uri);
		struct mg_handler_info *tmp_rh;
		int step, matched;

		if (!conn || !conn->phys_ctx || !conn->dom_ctx) {
			return 0;
		}

		mg_lock_context(conn->phys_ctx);

		for (step = 0; step < 3; step++) {
			for (tmp_rh = conn->dom_ctx->handlers; tmp_rh != NULL;
			     tmp_rh = tmp_rh->next) {
				if (tmp_rh->handler_type != handler_type) {
					continue;
				}
				if (step == 0) {
					/* first try for an exact match */
					matched = (tmp_rh->uri_len == urilen)
					          && (strcmp(tmp_rh->uri, uri) == 0);
				} else if (step == 1) {
					/* next try for a partial match, we will accept
					uri/something */
					matched =
					    (tmp_rh->uri_len < urilen)
					    && (uri[tmp_rh->uri_len] == '/')
					    && (memcmp(tmp_rh->uri, uri, tmp_rh->uri_len) == 0);
				} else {
					/* finally try for pattern match */
					matched =
					    match_prefix(tmp_rh->uri, tmp_rh->uri_len, uri) > 0;
				}
				if (matched) {
					if (handler_type == WEBSOCKET_HANDLER) {
						*subprotocols = tmp_rh->subprotocols;
						*connect_handler = tmp_rh->connect_handler;
						*ready_handler = tmp_rh->ready_handler;
						*data_handler = tmp_rh->data_handler;
						*close_handler = tmp_rh->close_handler;
					} else if (handler_type == REQUEST_HANDLER) {
						if (tmp_rh->removing) {
							/* Treat as none found */
							step = 2;
							break;
						}
						*handler = tmp_rh->handler;
						/* Acquire handler and give it back */
						tmp_rh->refcount++;
						*handler_info = tmp_rh;
					} else { /* AUTH_HANDLER */
						*auth_handler = tmp_rh->auth_handler;
					}
					*cbdata = tmp_rh->cbdata;
					mg_unlock_context(conn->phys_ctx);
					return 1;
				}
			}
		}

		mg_unlock_context(conn->phys_ctx);
	}
	return 0; /* none found */
}